

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O2

AggregateFunction * __thiscall
duckdb::ScalarContinuousQuantile::GetFunction<duckdb::date_t,duckdb::timestamp_t>
          (AggregateFunction *__return_storage_ptr__,ScalarContinuousQuantile *this,
          LogicalType *input_type,LogicalType *target_type)

{
  LogicalType local_40;
  
  LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffffd8,(LogicalType *)this);
  LogicalType::LogicalType(&local_40,input_type);
  AggregateFunction::
  UnaryAggregateDestructor<duckdb::QuantileState<duckdb::date_t,duckdb::QuantileStandardType>,duckdb::date_t,duckdb::timestamp_t,duckdb::QuantileScalarOperation<false,duckdb::QuantileStandardType>,(duckdb::AggregateDestructorType)1>
            (__return_storage_ptr__,(AggregateFunction *)&stack0xffffffffffffffd8,&local_40,
             target_type);
  LogicalType::~LogicalType(&local_40);
  LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffffd8);
  __return_storage_ptr__->order_dependent = NOT_ORDER_DEPENDENT;
  __return_storage_ptr__->window =
       QuantileScalarOperation<false,duckdb::QuantileStandardType>::
       Window<duckdb::QuantileState<duckdb::date_t,duckdb::QuantileStandardType>,duckdb::date_t,duckdb::timestamp_t>
  ;
  __return_storage_ptr__->window_init =
       QuantileOperation::
       WindowInit<duckdb::QuantileState<duckdb::date_t,duckdb::QuantileStandardType>,duckdb::date_t>
  ;
  return __return_storage_ptr__;
}

Assistant:

static AggregateFunction GetFunction(const LogicalType &input_type, const LogicalType &target_type) {
		using STATE = QuantileState<INPUT_TYPE, QuantileStandardType>;
		using OP = QuantileScalarOperation<false>;
		auto fun =
		    AggregateFunction::UnaryAggregateDestructor<STATE, INPUT_TYPE, TARGET_TYPE, OP,
		                                                AggregateDestructorType::LEGACY>(input_type, target_type);
		fun.order_dependent = AggregateOrderDependent::NOT_ORDER_DEPENDENT;
#ifndef DUCKDB_SMALLER_BINARY
		fun.window = OP::template Window<STATE, INPUT_TYPE, TARGET_TYPE>;
		fun.window_init = OP::template WindowInit<STATE, INPUT_TYPE>;
#endif
		return fun;
	}